

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack16.h
# Opt level: O0

void ncnn::convdw5x5s2_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined8 *puVar8;
  undefined1 (*pauVar9) [64];
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar10 [64];
  __m512 _k44;
  __m512 _k43;
  __m512 _k42;
  __m512 _k41;
  __m512 _k40;
  __m512 _r44;
  __m512 _r43;
  __m512 _r42;
  __m512 _r41;
  __m512 _r40;
  __m512 _k34;
  __m512 _k33;
  __m512 _k32;
  __m512 _k31;
  __m512 _k30;
  __m512 _r34;
  __m512 _r33;
  __m512 _r32;
  __m512 _r31;
  __m512 _r30;
  __m512 _k24;
  __m512 _k23;
  __m512 _k22;
  __m512 _k21;
  __m512 _k20;
  __m512 _r24;
  __m512 _r23;
  __m512 _r22;
  __m512 _r21;
  __m512 _r20;
  __m512 _k14;
  __m512 _k13;
  __m512 _k12;
  __m512 _k11;
  __m512 _k10;
  __m512 _r14;
  __m512 _r13;
  __m512 _r12;
  __m512 _r11;
  __m512 _r10;
  __m512 _k04;
  __m512 _k03;
  __m512 _k02;
  __m512 _k01;
  __m512 _k00;
  __m512 _r04;
  __m512 _r03;
  __m512 _r02;
  __m512 _r01;
  __m512 _r00;
  __m512 _sum0;
  int j;
  int i;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m512 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  int local_1918;
  int local_1914;
  undefined1 (*local_1910) [64];
  undefined1 (*local_1908) [64];
  undefined1 (*local_1900) [64];
  undefined1 (*local_18f8) [64];
  undefined1 (*local_18f0) [64];
  undefined8 *local_18a0;
  int local_17cc;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  lVar6 = in_RDI[7];
  iVar7 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 0x10;
  lVar3 = *in_RCX;
  for (local_17cc = 0; local_17cc < (int)lVar6; local_17cc = local_17cc + 1) {
    local_18a0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_17cc * in_RSI[2]);
    if (lVar3 == 0) {
      local_26c0 = 0;
      uStack_26b8 = 0;
      uStack_26b0 = 0;
      uStack_26a8 = 0;
      uStack_26a0 = 0;
      uStack_2698 = 0;
      uStack_2690 = 0;
      uStack_2688 = 0;
    }
    else {
      puVar8 = (undefined8 *)(lVar3 + (long)(local_17cc << 4) * 4);
      local_26c0 = *puVar8;
      uStack_26b8 = puVar8[1];
      uStack_26b0 = puVar8[2];
      uStack_26a8 = puVar8[3];
      uStack_26a0 = puVar8[4];
      uStack_2698 = puVar8[5];
      uStack_2690 = puVar8[6];
      uStack_2688 = puVar8[7];
    }
    pauVar9 = (undefined1 (*) [64])
              (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_17cc * in_RDX[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    local_18f0 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_17cc * in_RDI[2]);
    lVar4 = in_RDI[2];
    local_18f8 = (undefined1 (*) [64])(*local_18f0 + iVar2 * lVar4);
    local_1900 = (undefined1 (*) [64])(*local_18f0 + (long)iVar2 * 2 * lVar4);
    local_1908 = (undefined1 (*) [64])(*local_18f0 + (long)iVar2 * 3 * lVar4);
    local_1910 = (undefined1 (*) [64])(*local_18f0 + (long)iVar2 * 4 * lVar4);
    for (local_1914 = 0; local_1914 < (int)lVar5; local_1914 = local_1914 + 1) {
      for (local_1918 = 0; local_1918 < iVar1; local_1918 = local_1918 + 1) {
        auVar10._8_8_ = uStack_26b8;
        auVar10._0_8_ = local_26c0;
        auVar10._16_8_ = uStack_26b0;
        auVar10._24_8_ = uStack_26a8;
        auVar10._32_8_ = uStack_26a0;
        auVar10._40_8_ = uStack_2698;
        auVar10._48_8_ = uStack_2690;
        auVar10._56_8_ = uStack_2688;
        auVar10 = vfmadd213ps_avx512f(*local_18f0,*pauVar9,auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f0[1],pauVar9[1],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f0[2],pauVar9[2],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f0[3],pauVar9[3],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f0[4],pauVar9[4],auVar10);
        auVar10 = vfmadd213ps_avx512f(*local_18f8,pauVar9[5],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f8[1],pauVar9[6],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f8[2],pauVar9[7],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f8[3],pauVar9[8],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_18f8[4],pauVar9[9],auVar10);
        auVar10 = vfmadd213ps_avx512f(*local_1900,pauVar9[10],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1900[1],pauVar9[0xb],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1900[2],pauVar9[0xc],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1900[3],pauVar9[0xd],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1900[4],pauVar9[0xe],auVar10);
        auVar10 = vfmadd213ps_avx512f(*local_1908,pauVar9[0xf],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1908[1],pauVar9[0x10],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1908[2],pauVar9[0x11],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1908[3],pauVar9[0x12],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1908[4],pauVar9[0x13],auVar10);
        auVar10 = vfmadd213ps_avx512f(*local_1910,pauVar9[0x14],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1910[1],pauVar9[0x15],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1910[2],pauVar9[0x16],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1910[3],pauVar9[0x17],auVar10);
        auVar10 = vfmadd213ps_avx512f(local_1910[4],pauVar9[0x18],auVar10);
        local_2d80 = auVar10._0_8_;
        uStack_2d78 = auVar10._8_8_;
        uStack_2d70 = auVar10._16_8_;
        uStack_2d68 = auVar10._24_8_;
        uStack_2d60 = auVar10._32_8_;
        uStack_2d58 = auVar10._40_8_;
        uStack_2d50 = auVar10._48_8_;
        uStack_2d48 = auVar10._56_8_;
        *local_18a0 = local_2d80;
        local_18a0[1] = uStack_2d78;
        local_18a0[2] = uStack_2d70;
        local_18a0[3] = uStack_2d68;
        local_18a0[4] = uStack_2d60;
        local_18a0[5] = uStack_2d58;
        local_18a0[6] = uStack_2d50;
        local_18a0[7] = uStack_2d48;
        local_18f0 = local_18f0 + 2;
        local_18f8 = local_18f8 + 2;
        local_1900 = local_1900 + 2;
        local_1908 = local_1908 + 2;
        local_1910 = local_1910 + 2;
        local_18a0 = local_18a0 + 8;
      }
      local_18f0 = (undefined1 (*) [64])(*local_18f0 + (long)iVar7 * 4);
      local_18f8 = (undefined1 (*) [64])(*local_18f8 + (long)iVar7 * 4);
      local_1900 = (undefined1 (*) [64])(*local_1900 + (long)iVar7 * 4);
      local_1908 = (undefined1 (*) [64])(*local_1908 + (long)iVar7 * 4);
      local_1910 = (undefined1 (*) [64])(*local_1910 + (long)iVar7 * 4);
    }
  }
  return;
}

Assistant:

static void convdw5x5s2_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 16;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m512 _bias0 = bias ? _mm512_loadu_ps((const float*)bias + g * 16) : _mm512_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m512 _sum0 = _bias0;

                __m512 _r00 = _mm512_load_ps(r0);
                __m512 _r01 = _mm512_load_ps(r0 + 16);
                __m512 _r02 = _mm512_load_ps(r0 + 32);
                __m512 _r03 = _mm512_load_ps(r0 + 48);
                __m512 _r04 = _mm512_load_ps(r0 + 64);

                __m512 _k00 = _mm512_load_ps(k0);
                __m512 _k01 = _mm512_load_ps(k0 + 16);
                __m512 _k02 = _mm512_load_ps(k0 + 32);
                __m512 _k03 = _mm512_load_ps(k0 + 48);
                __m512 _k04 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm512_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm512_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm512_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm512_fmadd_ps(_k04, _r04, _sum0);

                __m512 _r10 = _mm512_load_ps(r1);
                __m512 _r11 = _mm512_load_ps(r1 + 16);
                __m512 _r12 = _mm512_load_ps(r1 + 32);
                __m512 _r13 = _mm512_load_ps(r1 + 48);
                __m512 _r14 = _mm512_load_ps(r1 + 64);

                __m512 _k10 = _mm512_load_ps(k0);
                __m512 _k11 = _mm512_load_ps(k0 + 16);
                __m512 _k12 = _mm512_load_ps(k0 + 32);
                __m512 _k13 = _mm512_load_ps(k0 + 48);
                __m512 _k14 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm512_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm512_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm512_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm512_fmadd_ps(_k14, _r14, _sum0);

                __m512 _r20 = _mm512_load_ps(r2);
                __m512 _r21 = _mm512_load_ps(r2 + 16);
                __m512 _r22 = _mm512_load_ps(r2 + 32);
                __m512 _r23 = _mm512_load_ps(r2 + 48);
                __m512 _r24 = _mm512_load_ps(r2 + 64);

                __m512 _k20 = _mm512_load_ps(k0);
                __m512 _k21 = _mm512_load_ps(k0 + 16);
                __m512 _k22 = _mm512_load_ps(k0 + 32);
                __m512 _k23 = _mm512_load_ps(k0 + 48);
                __m512 _k24 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm512_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm512_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm512_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm512_fmadd_ps(_k24, _r24, _sum0);

                __m512 _r30 = _mm512_load_ps(r3);
                __m512 _r31 = _mm512_load_ps(r3 + 16);
                __m512 _r32 = _mm512_load_ps(r3 + 32);
                __m512 _r33 = _mm512_load_ps(r3 + 48);
                __m512 _r34 = _mm512_load_ps(r3 + 64);

                __m512 _k30 = _mm512_load_ps(k0);
                __m512 _k31 = _mm512_load_ps(k0 + 16);
                __m512 _k32 = _mm512_load_ps(k0 + 32);
                __m512 _k33 = _mm512_load_ps(k0 + 48);
                __m512 _k34 = _mm512_load_ps(k0 + 64);
                k0 += 80;

                _sum0 = _mm512_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm512_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm512_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm512_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm512_fmadd_ps(_k34, _r34, _sum0);

                __m512 _r40 = _mm512_load_ps(r4);
                __m512 _r41 = _mm512_load_ps(r4 + 16);
                __m512 _r42 = _mm512_load_ps(r4 + 32);
                __m512 _r43 = _mm512_load_ps(r4 + 48);
                __m512 _r44 = _mm512_load_ps(r4 + 64);

                __m512 _k40 = _mm512_load_ps(k0);
                __m512 _k41 = _mm512_load_ps(k0 + 16);
                __m512 _k42 = _mm512_load_ps(k0 + 32);
                __m512 _k43 = _mm512_load_ps(k0 + 48);
                __m512 _k44 = _mm512_load_ps(k0 + 64);
                k0 -= 320;

                _sum0 = _mm512_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm512_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm512_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm512_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm512_fmadd_ps(_k44, _r44, _sum0);

                _mm512_store_ps(outptr0, _sum0);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                r4 += 32;
                outptr0 += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}